

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

char * format_telnet_command(SockAddr *addr,int port,Conf *conf,uint *flags_out)

{
  BinarySink *bs;
  char cVar1;
  uint uVar2;
  char *pcVar3;
  strbuf *buf_o;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  uchar val;
  byte bVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  char dest [512];
  uint local_274;
  char local_238 [520];
  
  pcVar3 = conf_get_str(conf,0x12);
  buf_o = strbuf_new();
  if (*pcVar3 == '\0') {
    local_274 = 0;
  }
  else {
    bs = buf_o->binarysink_;
    uVar13 = 0;
    local_274 = 0;
    pcVar5 = pcVar3;
    do {
      iVar8 = (int)uVar13;
      lVar4 = (long)iVar8;
      lVar9 = lVar4 << 0x20;
      lVar12 = 0;
      iVar14 = iVar8;
      while( true ) {
        iVar14 = iVar14 + 1;
        cVar1 = pcVar3[lVar12 + lVar4];
        iVar11 = (int)lVar12;
        if (cVar1 == '\0') {
          if (iVar11 == 0) goto LAB_0011b7a7;
          iVar14 = iVar11 + iVar8;
          goto LAB_0011b789;
        }
        if ((cVar1 == '%') || (cVar1 == '\\')) break;
        lVar12 = lVar12 + 1;
        lVar9 = lVar9 + 0x100000000;
      }
      if (iVar11 != 0) {
        BinarySink_put_data(bs,pcVar5,(long)iVar11);
      }
      uVar13 = uVar13 + lVar12 + 1;
      bVar10 = pcVar3[(int)uVar13];
      if (bVar10 == 0) {
        lVar4 = lVar9 >> 0x20;
        iVar14 = iVar11 + iVar8 + 1;
        iVar8 = iVar8 + iVar11;
LAB_0011b789:
        BinarySink_put_data(bs,pcVar3 + lVar4,(long)(iVar14 - iVar8));
        break;
      }
      if (pcVar3[lVar12 + lVar4] == '\\') {
        if (bVar10 < 0x6e) {
          if (bVar10 == 0x25) {
            val = '%';
          }
          else {
            if (bVar10 == 0x58) {
LAB_0011b532:
              pcVar5 = pcVar3 + (long)iVar14 + 1;
              bVar7 = false;
              bVar10 = 0;
              while( true ) {
                cVar1 = *pcVar5;
                if ((byte)(cVar1 - 0x30U) < 10) {
                  bVar10 = cVar1 - 0x30U | bVar10;
                }
                else if ((byte)(cVar1 + 0x9fU) < 6) {
                  bVar10 = cVar1 + bVar10 + 0xa9;
                }
                else {
                  if (5 < (byte)(cVar1 + 0xbfU)) {
                    BinarySink_put_byte(bs,'\\');
                    uVar13 = uVar13 & 0xffffffff;
                    goto LAB_0011b655;
                  }
                  bVar10 = (cVar1 + bVar10) - 0x37;
                }
                if (bVar7) break;
                bVar10 = bVar10 << 4;
                pcVar5 = pcVar5 + 1;
                bVar7 = true;
              }
              BinarySink_put_byte(bs,bVar10);
              uVar13 = (ulong)(iVar8 + iVar11 + 4);
              goto LAB_0011b655;
            }
            if (bVar10 != 0x5c) goto LAB_0011b5e9;
            val = '\\';
          }
LAB_0011b61c:
          BinarySink_put_byte(bs,val);
        }
        else {
          if (bVar10 < 0x74) {
            if (bVar10 == 0x6e) {
              val = '\n';
            }
            else {
              if (bVar10 != 0x72) goto LAB_0011b5e9;
              val = '\r';
            }
            goto LAB_0011b61c;
          }
          if (bVar10 == 0x74) {
            val = '\t';
            goto LAB_0011b61c;
          }
          if (bVar10 == 0x78) goto LAB_0011b532;
LAB_0011b5e9:
          BinarySink_put_data(bs,pcVar3 + lVar12 + lVar4,2);
        }
        uVar13 = (ulong)(iVar8 + iVar11 + 2);
      }
      else {
        if (bVar10 == 0x25) {
          BinarySink_put_byte(bs,'%');
          uVar13 = (ulong)(iVar8 + iVar11 + 2);
          goto LAB_0011b655;
        }
        pcVar5 = pcVar3 + (int)uVar13;
        iVar14 = strncasecmp(pcVar5,"host",4);
        if (iVar14 == 0) {
          sk_getaddr(addr,local_238,0x200);
          sVar6 = strlen(local_238);
          BinarySink_put_data(bs,local_238,sVar6);
LAB_0011b644:
          uVar13 = (ulong)(iVar8 + iVar11 + 5);
        }
        else {
          iVar14 = strncasecmp(pcVar5,"port",4);
          if (iVar14 == 0) {
            BinarySink_put_fmt(bs,"%d",(ulong)(uint)port);
            goto LAB_0011b644;
          }
          iVar14 = strncasecmp(pcVar5,"user",4);
          if (iVar14 == 0) {
            pcVar5 = conf_get_str(conf,0x10);
            sVar6 = strlen(pcVar5);
            BinarySink_put_data(bs,pcVar5,sVar6);
            uVar13 = (ulong)(iVar8 + iVar11 + 5);
            local_274 = local_274 | *pcVar5 == '\0';
          }
          else {
            iVar14 = strncasecmp(pcVar5,"pass",4);
            if (iVar14 == 0) {
              pcVar5 = conf_get_str(conf,0x11);
              sVar6 = strlen(pcVar5);
              BinarySink_put_data(bs,pcVar5,sVar6);
              uVar13 = (ulong)(iVar8 + iVar11 + 5);
              if (*pcVar5 == '\0') {
                local_274 = local_274 | 2;
              }
            }
            else {
              iVar14 = strncasecmp(pcVar5,"proxyhost",9);
              if (iVar14 == 0) {
                pcVar5 = conf_get_str(conf,0xe);
                sVar6 = strlen(pcVar5);
                BinarySink_put_data(bs,pcVar5,sVar6);
              }
              else {
                iVar14 = strncasecmp(pcVar5,"proxyport",9);
                if (iVar14 != 0) {
                  BinarySink_put_byte(bs,'%');
                  uVar13 = uVar13 & 0xffffffff;
                  goto LAB_0011b655;
                }
                uVar2 = conf_get_int(conf,0xf);
                BinarySink_put_fmt(bs,"%d",(ulong)uVar2);
              }
              uVar13 = (ulong)(iVar8 + iVar11 + 10);
            }
          }
        }
      }
LAB_0011b655:
      pcVar5 = pcVar3 + (int)uVar13;
    } while (pcVar3[(int)uVar13] != '\0');
  }
LAB_0011b7a7:
  if (flags_out != (uint *)0x0) {
    *flags_out = local_274;
  }
  pcVar3 = strbuf_to_str(buf_o);
  return pcVar3;
}

Assistant:

char *format_telnet_command(SockAddr *addr, int port, Conf *conf,
                            unsigned *flags_out)
{
    char *fmt = conf_get_str(conf, CONF_proxy_telnet_command);
    int so = 0, eo = 0;
    strbuf *buf = strbuf_new();
    unsigned flags = 0;

    /* we need to escape \\, \%, \r, \n, \t, \x??, \0???,
     * %%, %host, %port, %user, and %pass
     */

    while (fmt[eo] != 0) {

        /* scan forward until we hit end-of-line,
         * or an escape character (\ or %) */
        while (fmt[eo] != 0 && fmt[eo] != '%' && fmt[eo] != '\\')
            eo++;

        /* if we hit eol, break out of our escaping loop */
        if (fmt[eo] == 0) break;

        /* if there was any unescaped text before the escape
         * character, send that now */
        if (eo != so)
            put_data(buf, fmt + so, eo - so);

        so = eo++;

        /* if the escape character was the last character of
         * the line, we'll just stop and send it. */
        if (fmt[eo] == 0) break;

        if (fmt[so] == '\\') {

            /* we recognize \\, \%, \r, \n, \t, \x??.
             * anything else, we just send unescaped (including the \).
             */

            switch (fmt[eo]) {

              case '\\':
                put_byte(buf, '\\');
                eo++;
                break;

              case '%':
                put_byte(buf, '%');
                eo++;
                break;

              case 'r':
                put_byte(buf, '\r');
                eo++;
                break;

              case 'n':
                put_byte(buf, '\n');
                eo++;
                break;

              case 't':
                put_byte(buf, '\t');
                eo++;
                break;

              case 'x':
              case 'X': {
                /* escaped hexadecimal value (ie. \xff) */
                unsigned char v = 0;
                int i = 0;

                for (;;) {
                  eo++;
                  if (fmt[eo] >= '0' && fmt[eo] <= '9')
                      v += fmt[eo] - '0';
                  else if (fmt[eo] >= 'a' && fmt[eo] <= 'f')
                      v += fmt[eo] - 'a' + 10;
                  else if (fmt[eo] >= 'A' && fmt[eo] <= 'F')
                      v += fmt[eo] - 'A' + 10;
                  else {
                    /* non hex character, so we abort and just
                     * send the whole thing unescaped (including \x)
                     */
                    put_byte(buf, '\\');
                    eo = so + 1;
                    break;
                  }

                  /* we only extract two hex characters */
                  if (i == 1) {
                    put_byte(buf, v);
                    eo++;
                    break;
                  }

                  i++;
                  v <<= 4;
                }
                break;
              }

              default:
                put_data(buf, fmt + so, 2);
                eo++;
                break;
            }
        } else {

            /* % escape. we recognize %%, %host, %port, %user, %pass.
             * %proxyhost, %proxyport. Anything else we just send
             * unescaped (including the %).
             */

            if (fmt[eo] == '%') {
                put_byte(buf, '%');
                eo++;
            }
            else if (strnicmp(fmt + eo, "host", 4) == 0) {
                char dest[512];
                sk_getaddr(addr, dest, lenof(dest));
                put_data(buf, dest, strlen(dest));
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "port", 4) == 0) {
                put_fmt(buf, "%d", port);
                eo += 4;
            }
            else if (strnicmp(fmt + eo, "user", 4) == 0) {
                const char *username = conf_get_str(conf, CONF_proxy_username);
                put_data(buf, username, strlen(username));
                eo += 4;
                if (!*username)
                    flags |= TELNET_CMD_MISSING_USERNAME;
            }
            else if (strnicmp(fmt + eo, "pass", 4) == 0) {
                const char *password = conf_get_str(conf, CONF_proxy_password);
                put_data(buf, password, strlen(password));
                eo += 4;
                if (!*password)
                    flags |= TELNET_CMD_MISSING_PASSWORD;
            }
            else if (strnicmp(fmt + eo, "proxyhost", 9) == 0) {
                const char *host = conf_get_str(conf, CONF_proxy_host);
                put_data(buf, host, strlen(host));
                eo += 9;
            }
            else if (strnicmp(fmt + eo, "proxyport", 9) == 0) {
                int port = conf_get_int(conf, CONF_proxy_port);
                put_fmt(buf, "%d", port);
                eo += 9;
            }
            else {
                /* we don't escape this, so send the % now, and
                 * don't advance eo, so that we'll consider the
                 * text immediately following the % as unescaped.
                 */
                put_byte(buf, '%');
            }
        }

        /* resume scanning for additional escapes after this one. */
        so = eo;
    }

    /* if there is any unescaped text at the end of the line, send it */
    if (eo != so) {
        put_data(buf, fmt + so, eo - so);
    }

    if (flags_out)
        *flags_out = flags;
    return strbuf_to_str(buf);
}